

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_assertion_tests.cpp
# Opt level: O2

void __thiscall
string_assertion_test::iu_StrCaseTest_x_iutest_x_CaseEqRaw_Test<wchar_t>::Body
          (iu_StrCaseTest_x_iutest_x_CaseEqRaw_Test<wchar_t> *this)

{
  undefined *val2;
  AssertionResult iutest_ar;
  AssertionResult local_1f0;
  iuCodeMessage local_1c8;
  Fixed local_198;
  
  val2 = text<wchar_t>::test;
  iutest::internal::CmpHelperSTRCASEEQ
            (&local_1f0,"TestFixture::Text::Test","p",(wchar_t *)text<wchar_t>::Test,
             (wchar_t *)text<wchar_t>::test);
  if (local_1f0.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xb5,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::CmpHelperSTRCASEEQ
              (&local_1f0,"TestFixture::Text::Test","p",(wchar_t *)text<wchar_t>::Test,
               (wchar_t *)val2);
    if (local_1f0.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
                 ,0xb6,local_1f0.m_message._M_dataplus._M_p);
      local_1c8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
      std::__cxx11::string::~string((string *)&local_1c8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::internal::CmpHelperSTRCASEEQ
              (&local_1f0,"TestFixture::Text::Test","p",(wchar_t *)text<wchar_t>::Test,
               (wchar_t *)val2);
    if (local_1f0.m_result != false) goto LAB_002d33ab;
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/string_assertion_tests.cpp"
               ,0xb7,local_1f0.m_message._M_dataplus._M_p);
    local_1c8._44_4_ = 0xffffffff;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c8,&local_198);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_002d33ab:
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StrCaseTest, CaseEqRaw)
{
    const TypeParam* p = TestFixture::Text::test;
    IUTEST_ASSERT_STRCASEEQ(TestFixture::Text::Test, p);
    IUTEST_EXPECT_STRCASEEQ(TestFixture::Text::Test, p);
    IUTEST_INFORM_STRCASEEQ(TestFixture::Text::Test, p);
}